

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode duckdb_brotli::SkipMetadataBlock(BrotliDecoderStateInternal *s)

{
  uint8_t **ppuVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  BrotliDecoderErrorCode BVar6;
  int iVar7;
  size_t sVar8;
  uint8_t *puVar9;
  uint8_t *__dest;
  uint uVar10;
  size_t __n;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  uint8_t buffer [8];
  uint8_t local_38 [8];
  
  puVar9 = local_38;
  iVar3 = s->meta_block_remaining_len;
  BVar6 = BROTLI_DECODER_SUCCESS;
  if (iVar3 != 0) {
    uVar4 = (s->br).bit_pos_;
    if (7 < uVar4) {
      iVar7 = (int)uVar4 >> 3;
      if (iVar3 <= iVar7) {
        iVar7 = iVar3;
      }
      sVar11 = (size_t)iVar7;
      uVar4 = (s->br).bit_pos_;
      bVar12 = iVar7 != 0;
      __dest = local_38;
      __n = sVar11;
      if ((7 < uVar4) && (__dest = local_38, iVar7 != 0)) {
        uVar5 = (s->br).val_;
        sVar8 = sVar11;
        do {
          *puVar9 = (char)uVar5;
          uVar4 = uVar4 - 8;
          uVar5 = uVar5 >> 8;
          puVar9 = puVar9 + 1;
          __n = sVar8 - 1;
          bVar12 = sVar8 != 1;
          if (uVar4 < 8) break;
          bVar13 = sVar8 != 1;
          sVar8 = __n;
        } while (bVar13);
        (s->br).val_ = uVar5;
        (s->br).bit_pos_ = uVar4;
        __dest = puVar9;
      }
      if (uVar4 < 0x40) {
        (s->br).val_ = (s->br).val_ & ~(-1L << ((byte)uVar4 & 0x3f));
      }
      if (bVar12) {
        puVar9 = (s->br).next_in;
        switchD_015ff80e::default(__dest,puVar9,__n);
        (s->br).next_in = puVar9 + __n;
      }
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,local_38,sVar11);
      }
      piVar2 = &s->meta_block_remaining_len;
      *piVar2 = *piVar2 - iVar7;
      if (*piVar2 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    uVar4 = (long)(s->br).last_in - (long)(s->br).next_in;
    uVar10 = 0x40000000;
    if (uVar4 < 0x40000001) {
      uVar10 = (int)((s->br).bit_pos_ >> 3) + (int)uVar4;
    }
    if (s->meta_block_remaining_len < (int)uVar10) {
      uVar10 = s->meta_block_remaining_len;
    }
    if (0 < (int)uVar10) {
      if (s->metadata_chunk_func != (brotli_decoder_metadata_chunk_func)0x0) {
        (*s->metadata_chunk_func)(s->metadata_callback_opaque,(s->br).next_in,(ulong)uVar10);
      }
      ppuVar1 = &(s->br).next_in;
      *ppuVar1 = *ppuVar1 + uVar10;
      piVar2 = &s->meta_block_remaining_len;
      *piVar2 = *piVar2 - uVar10;
      if (*piVar2 == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    BVar6 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  return BVar6;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE SkipMetadataBlock(BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;

	if (s->meta_block_remaining_len == 0) {
		return BROTLI_DECODER_SUCCESS;
	}

	BROTLI_DCHECK((BrotliGetAvailableBits(br) & 7) == 0);

	/* Drain accumulator. */
	if (BrotliGetAvailableBits(br) >= 8) {
		uint8_t buffer[8];
		int nbytes = (int)(BrotliGetAvailableBits(br)) >> 3;
		BROTLI_DCHECK(nbytes <= 8);
		if (nbytes > s->meta_block_remaining_len) {
			nbytes = s->meta_block_remaining_len;
		}
		BrotliCopyBytes(buffer, br, (size_t)nbytes);
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, buffer, (size_t)nbytes);
		}
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	/* Direct access to metadata is possible. */
	int nbytes = (int)BrotliGetRemainingBytes(br);
	if (nbytes > s->meta_block_remaining_len) {
		nbytes = s->meta_block_remaining_len;
	}
	if (nbytes > 0) {
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, br->next_in, (size_t)nbytes);
		}
		BrotliDropBytes(br, (size_t)nbytes);
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	BROTLI_DCHECK(BrotliGetRemainingBytes(br) == 0);

	return BROTLI_DECODER_NEEDS_MORE_INPUT;
}